

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O0

void Logger::queueError<unsigned_long,long,StringLiteral>
               (ErrorType type,char *text,unsigned_long *args,long *args_1,StringLiteral *args_2)

{
  ErrorType type_00;
  size_t extraout_RDX;
  StringLiteral *in_R9;
  string_view text_00;
  undefined1 local_50 [8];
  string message;
  StringLiteral *args_local_2;
  long *args_local_1;
  unsigned_long *args_local;
  char *text_local;
  ErrorType type_local;
  
  message.field_2._8_8_ = args_2;
  tinyformat::format<unsigned_long,long,StringLiteral>
            ((string *)local_50,(tinyformat *)text,(char *)args,(unsigned_long *)args_1,
             (long *)args_2,in_R9);
  type_00 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
  text_00._M_str = (char *)args_1;
  text_00._M_len = extraout_RDX;
  queueError((Logger *)(ulong)type,type_00,text_00);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

static void queueError(ErrorType type, const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		queueError(type,message);
	}